

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t_const*,char8_t_const*,char8_t>
          (pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
           *__return_storage_ptr__,jessilib *this,char8_t *begin,char8_t *end,char8_t in_delim)

{
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar1;
  size_t local_78;
  char8_t *local_70;
  size_t local_68;
  char8_t *local_60;
  char8_t *local_58;
  char8_t *local_50;
  jessilib *local_48;
  char8_t *itr;
  pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
  result;
  char8_t in_delim_local;
  char8_t *end_local;
  char8_t *begin_local;
  
  result.second._M_str._7_1_ = SUB81(end,0);
  std::
  pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
  ::
  pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_true>
            ((pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
              *)&itr);
  local_48 = this;
  if (this < begin) {
    for (; local_48 != (jessilib *)begin; local_48 = local_48 + 1) {
      if (*local_48 == result.second._M_str._7_1_) {
        bVar1 = make_split_member<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_const_char8_t_*,_const_char8_t_*,_nullptr>
                          ((char8_t *)this,(char8_t *)local_48);
        local_58 = (char8_t *)bVar1._M_len;
        itr = local_58;
        local_50 = bVar1._M_str;
        result.first._M_len = (size_t)local_50;
        bVar1 = make_split_member<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_const_char8_t_*,_const_char8_t_*,_nullptr>
                          ((char8_t *)(local_48 + 1),begin);
        local_68 = bVar1._M_len;
        local_60 = bVar1._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)itr;
        (__return_storage_ptr__->first)._M_str = (char8_t *)result.first._M_len;
        (__return_storage_ptr__->second)._M_len = local_68;
        (__return_storage_ptr__->second)._M_str = local_60;
        return __return_storage_ptr__;
      }
    }
    bVar1 = make_split_member<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_const_char8_t_*,_const_char8_t_*,_nullptr>
                      ((char8_t *)this,begin);
    local_78 = bVar1._M_len;
    local_70 = bVar1._M_str;
    (__return_storage_ptr__->first)._M_len = local_78;
    (__return_storage_ptr__->first)._M_str = local_70;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char8_t *)result.second._M_len;
  }
  else {
    (__return_storage_ptr__->first)._M_len = (size_t)itr;
    (__return_storage_ptr__->first)._M_str = (char8_t *)result.first._M_len;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char8_t *)result.second._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}